

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  long lVar1;
  bool bVar2;
  type_conflict5 tVar3;
  SPxStatus SVar4;
  int iVar5;
  Status SVar6;
  int iVar7;
  Section SVar8;
  ostream *poVar9;
  Status *pSVar10;
  ulong *puVar11;
  char *pcVar12;
  long in_RCX;
  long in_RDX;
  istream *in_RSI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int r;
  int c;
  MPSInput mps;
  int i_2;
  int i_1;
  Desc l_desc;
  DataKey key_1;
  int i;
  stringstream name_1;
  int nRows;
  DataKey key;
  int j;
  stringstream name;
  int nCols;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  NameSet *cNames;
  NameSet *rNames;
  undefined4 in_stack_fffffffffffff5a8;
  int in_stack_fffffffffffff5ac;
  byte bVar13;
  Type in_stack_fffffffffffff5b0;
  Type in_stack_fffffffffffff5b4;
  Status in_stack_fffffffffffff5b8;
  Type in_stack_fffffffffffff5bc;
  Type in_stack_fffffffffffff5c0;
  Status in_stack_fffffffffffff5c4;
  Desc *in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  Real in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e4;
  undefined1 in_stack_fffffffffffff5e5;
  undefined1 in_stack_fffffffffffff5e6;
  undefined1 in_stack_fffffffffffff5e7;
  undefined8 in_stack_fffffffffffff5e8;
  undefined7 in_stack_fffffffffffff5f0;
  undefined1 in_stack_fffffffffffff5f7;
  undefined6 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff606;
  type_conflict5 tVar14;
  undefined1 in_stack_fffffffffffff607;
  DataKey *in_stack_fffffffffffff608;
  undefined7 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff617;
  DataKey in_stack_fffffffffffff648;
  int local_978;
  int in_stack_fffffffffffff6d4;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff764;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff768;
  ulong local_610;
  undefined1 local_608 [128];
  undefined1 local_588 [128];
  ulong local_508;
  undefined1 local_500 [128];
  int local_480;
  int local_47c;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_478;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_460;
  string local_438 [32];
  DataKey local_418;
  DataKey local_410;
  int local_404;
  stringstream local_400 [16];
  ostream local_3f0 [380];
  int local_274;
  string local_270 [32];
  DataKey local_250;
  DataKey local_248;
  int local_240;
  stringstream local_230 [16];
  ostream local_220 [380];
  int local_a4;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  istream *local_70;
  undefined8 local_60;
  ulong *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  ulong *local_28;
  undefined1 *local_20;
  ulong *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_98 = 0;
  local_a0 = 0;
  local_90 = in_RCX;
  local_88 = in_RDX;
  local_80 = in_RCX;
  local_78 = in_RDX;
  local_70 = in_RSI;
  if (in_RCX == 0) {
    local_a4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x685a4f);
    std::__cxx11::stringstream::stringstream(local_230);
    spx_alloc<soplex::NameSet*>
              ((NameSet **)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20));
    lVar1 = local_98;
    NameSet::NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
                     (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),(int)in_stack_fffffffffffff5e8,
                     (Real)CONCAT17(in_stack_fffffffffffff5e7,
                                    CONCAT16(in_stack_fffffffffffff5e6,
                                             CONCAT15(in_stack_fffffffffffff5e5,
                                                      CONCAT14(in_stack_fffffffffffff5e4,
                                                               in_stack_fffffffffffff5e0)))),
                     in_stack_fffffffffffff5d8);
    local_98 = lVar1;
    NameSet::reMax((NameSet *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   in_stack_fffffffffffff5ac);
    for (local_240 = 0; local_240 < local_a4; local_240 = local_240 + 1) {
      poVar9 = std::operator<<(local_220,"x");
      std::ostream::operator<<(poVar9,local_240);
      local_250 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::colId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                                   0);
      local_248 = local_250;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add((NameSet *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
                   in_stack_fffffffffffff608,
                   (char *)CONCAT17(in_stack_fffffffffffff607,
                                    CONCAT16(in_stack_fffffffffffff606,in_stack_fffffffffffff600)));
      std::__cxx11::string::~string(local_270);
    }
    local_90 = local_98;
    std::__cxx11::stringstream::~stringstream(local_230);
  }
  if (local_88 == 0) {
    local_274 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x685c59);
    std::__cxx11::stringstream::stringstream(local_400);
    spx_alloc<soplex::NameSet*>
              ((NameSet **)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
               (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20));
    lVar1 = local_a0;
    NameSet::NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
                     (int)((ulong)in_stack_fffffffffffff5e8 >> 0x20),(int)in_stack_fffffffffffff5e8,
                     (Real)CONCAT17(in_stack_fffffffffffff5e7,
                                    CONCAT16(in_stack_fffffffffffff5e6,
                                             CONCAT15(in_stack_fffffffffffff5e5,
                                                      CONCAT14(in_stack_fffffffffffff5e4,
                                                               in_stack_fffffffffffff5e0)))),
                     in_stack_fffffffffffff5d8);
    local_a0 = lVar1;
    NameSet::reMax((NameSet *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   in_stack_fffffffffffff5ac);
    for (local_404 = 0; local_404 < local_274; local_404 = local_404 + 1) {
      poVar9 = std::operator<<(local_3f0,"C");
      std::ostream::operator<<(poVar9,local_404);
      in_stack_fffffffffffff648 =
           (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),0);
      local_418 = in_stack_fffffffffffff648;
      local_410 = in_stack_fffffffffffff648;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add((NameSet *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
                   in_stack_fffffffffffff608,
                   (char *)CONCAT17(in_stack_fffffffffffff607,
                                    CONCAT16(in_stack_fffffffffffff606,in_stack_fffffffffffff600)));
      std::__cxx11::string::~string(local_438);
    }
    local_88 = local_a0;
    std::__cxx11::stringstream::~stringstream(local_400);
  }
  SVar4 = status(in_RDI);
  if (SVar4 == NO_PROBLEM) {
    (*in_RDI->_vptr_SPxBasisBase[7])(in_RDI,in_RDI->theLP,0);
  }
  Desc::Desc((Desc *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
             in_stack_fffffffffffff5c8);
  for (local_47c = 0; iVar7 = local_47c,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x685eaf), iVar7 < iVar5; local_47c = local_47c + 1) {
    SVar6 = dualRowStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
    pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
              ::operator[](&local_478,local_47c);
    *pSVar10 = SVar6;
  }
  for (local_480 = 0; iVar7 = local_480,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x685f5d), iVar7 < iVar5; local_480 = local_480 + 1) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
            in_stack_fffffffffffff5ac);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
            in_stack_fffffffffffff5ac);
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x685fc9);
    if (bVar2) {
      pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                ::operator[](&local_460,local_480);
      *pSVar10 = P_FIXED;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
              in_stack_fffffffffffff5ac);
      puVar11 = (ulong *)infinity();
      local_508 = *puVar11 ^ 0x8000000000000000;
      local_50 = local_500;
      local_58 = &local_508;
      local_60 = 0;
      local_8 = local_58;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                 (double)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 (type *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6860a7);
      tVar14 = false;
      if (tVar3) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                in_stack_fffffffffffff5ac);
        local_40 = infinity();
        local_38 = local_588;
        local_48 = 0;
        local_10 = local_40;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   (double)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                   (type *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        tVar14 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)0x68614c);
      }
      if (tVar14 == false) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                in_stack_fffffffffffff5ac);
        puVar11 = (ulong *)infinity();
        local_610 = *puVar11 ^ 0x8000000000000000;
        local_20 = local_608;
        local_28 = &local_610;
        local_30 = 0;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   (double)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                   (type *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x686234);
        if (tVar3) {
          pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,local_480);
          *pSVar10 = P_ON_UPPER;
        }
        else {
          pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,local_480);
          *pSVar10 = P_ON_LOWER;
        }
      }
      else {
        pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                  ::operator[](&local_460,local_480);
        *pSVar10 = P_FREE;
      }
    }
  }
  MPSInput::MPSInput((MPSInput *)&stack0xfffffffffffff690,local_70);
  bVar2 = MPSInput::readLine((MPSInput *)in_stack_fffffffffffff648);
  if ((bVar2) &&
     (pcVar12 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff690), pcVar12 != (char *)0x0)) {
    pcVar12 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff690);
    iVar7 = strcmp(pcVar12,"NAME");
    if (iVar7 == 0) {
      while (bVar2 = MPSInput::readLine((MPSInput *)in_stack_fffffffffffff648), bVar2) {
        local_978 = -1;
        pcVar12 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff690);
        if (pcVar12 != (char *)0x0) {
          pcVar12 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff690);
          iVar7 = strcmp(pcVar12,"ENDATA");
          if (iVar7 == 0) {
            MPSInput::setSection((MPSInput *)&stack0xfffffffffffff690,ENDATA);
            break;
          }
        }
        pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
        if ((pcVar12 == (char *)0x0) ||
           (pcVar12 = MPSInput::field2((MPSInput *)&stack0xfffffffffffff690), pcVar12 == (char *)0x0
           )) break;
        MPSInput::field2((MPSInput *)&stack0xfffffffffffff690);
        iVar7 = NameSet::number((NameSet *)
                                CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                                (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0
                                                ));
        if (iVar7 < 0) break;
        pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
        if (*pcVar12 == 'X') {
          pcVar12 = MPSInput::field3((MPSInput *)&stack0xfffffffffffff690);
          if (pcVar12 == (char *)0x0) break;
          MPSInput::field3((MPSInput *)&stack0xfffffffffffff690);
          local_978 = NameSet::number((NameSet *)
                                      CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                                      (char *)CONCAT44(in_stack_fffffffffffff5b4,
                                                       in_stack_fffffffffffff5b0));
          if (local_978 < 0) break;
        }
        pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
        iVar5 = strcmp(pcVar12,"XU");
        if (iVar5 == 0) {
          in_stack_fffffffffffff5c4 =
               dualColStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
          pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,iVar7);
          *pSVar10 = in_stack_fffffffffffff5c4;
          in_stack_fffffffffffff5c0 =
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::type(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4);
          if (in_stack_fffffffffffff5c0 == GREATER_EQUAL) {
            pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                      ::operator[](&local_478,local_978);
            *pSVar10 = P_ON_LOWER;
          }
          else {
            in_stack_fffffffffffff5bc =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4);
            if (in_stack_fffffffffffff5bc == EQUAL) {
              pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_978);
              *pSVar10 = P_FIXED;
            }
            else {
              pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_978);
              *pSVar10 = P_ON_UPPER;
            }
          }
        }
        else {
          pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
          iVar5 = strcmp(pcVar12,"XL");
          if (iVar5 == 0) {
            in_stack_fffffffffffff5b8 =
                 dualColStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
            pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                      ::operator[](&local_460,iVar7);
            *pSVar10 = in_stack_fffffffffffff5b8;
            in_stack_fffffffffffff5b4 =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4);
            if (in_stack_fffffffffffff5b4 == LESS_EQUAL) {
              pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_978);
              *pSVar10 = P_ON_UPPER;
            }
            else {
              in_stack_fffffffffffff5b0 =
                   LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::type(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4);
              if (in_stack_fffffffffffff5b0 == EQUAL) {
                pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                          ::operator[](&local_478,local_978);
                *pSVar10 = P_FIXED;
              }
              else {
                pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                          ::operator[](&local_478,local_978);
                *pSVar10 = P_ON_LOWER;
              }
            }
          }
          else {
            pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
            iVar5 = strcmp(pcVar12,"UL");
            if (iVar5 == 0) {
              pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_460,iVar7);
              *pSVar10 = P_ON_UPPER;
            }
            else {
              pcVar12 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff690);
              iVar5 = strcmp(pcVar12,"LL");
              if (iVar5 != 0) {
                MPSInput::syntaxError
                          ((MPSInput *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                          );
                break;
              }
              pSVar10 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_460,iVar7);
              *pSVar10 = P_ON_LOWER;
            }
          }
        }
      }
    }
  }
  bVar2 = MPSInput::hasError((MPSInput *)&stack0xfffffffffffff690);
  if (!bVar2) {
    SVar8 = MPSInput::section((MPSInput *)&stack0xfffffffffffff690);
    if (SVar8 == ENDATA) {
      setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                in_stack_fffffffffffff5bc);
      (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&local_478);
    }
    else {
      MPSInput::syntaxError
                ((MPSInput *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    }
  }
  if (local_78 == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    spx_free<soplex::NameSet*>((NameSet **)0x6867c2);
  }
  if (local_80 == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    spx_free<soplex::NameSet*>((NameSet **)0x6867e7);
  }
  bVar2 = MPSInput::hasError((MPSInput *)&stack0xfffffffffffff690);
  bVar13 = bVar2 ^ 0xff;
  MPSInput::~MPSInput((MPSInput *)&stack0xfffffffffffff690);
  Desc::~Desc((Desc *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  return (bool)(bVar13 & 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}